

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MemberInitSeparator::operator()
          (MemberInitSeparator *this)

{
  Printer *pPVar1;
  
  if (this->separators_ == true) {
    io::Printer::Emit(this->printer_,2,",\n");
    return;
  }
  io::Printer::Emit(this->printer_,2,": ");
  pPVar1 = this->printer_ + 0x68;
  *(long *)pPVar1 = *(long *)pPVar1 + *(long *)(this->printer_ + 0x58);
  this->separators_ = true;
  return;
}

Assistant:

void operator()() {
    if (separators_) {
      printer_->Emit(",\n");
    } else {
      printer_->Emit(": ");
      printer_->Indent();
      separators_ = true;
    }
  }